

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

void dfg_stone_close_handler(CManager_conflict cm,CMConnection conn,int stone,void *client_data)

{
  CMbuffer p_Var1;
  long lVar2;
  int iVar3;
  __pid_t _Var4;
  CManager cm_00;
  long lVar5;
  pthread_t pVar6;
  undefined8 *in_RCX;
  uint in_EDX;
  undefined8 in_RSI;
  CMConnection in_RDI;
  EVmaster_msg_type unaff_retaddr;
  void *in_stack_00000008;
  EVmaster in_stack_00000010;
  timespec ts_1;
  timespec ts;
  int i;
  EVconn_shutdown_msg msg;
  CMFormat conn_shutdown_msg;
  int global_stone_id;
  event_path_data evp;
  EVclient client;
  CMFormat in_stack_ffffffffffffff78;
  FILE *pFVar7;
  CMConnection in_stack_ffffffffffffff80;
  CManager_conflict in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  int line;
  char *in_stack_ffffffffffffff98;
  CManager in_stack_ffffffffffffffa0;
  timespec local_58;
  int local_48;
  CMTraceType in_stack_ffffffffffffffbc;
  int local_34;
  
  line = (int)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  iVar3 = (int)((ulong)in_RSI >> 0x20);
  p_Var1 = (in_RDI->queued_data).buffer_to_free;
  local_34 = -1;
  cm_00 = (CManager)INT_CMlookup_format((CManager)*in_RCX,EVdfg_conn_shutdown_format_list);
  IntCManager_lock(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,line);
  INT_EVfreeze_stone(in_stack_ffffffffffffff88,(EVstone)((ulong)in_stack_ffffffffffffff80 >> 0x20));
  for (local_48 = 0; local_48 < p_Var1->ref_count; local_48 = local_48 + 1) {
    if (in_EDX == *(uint *)((long)&p_Var1->next->buffer + (long)local_48 * 8 + 4)) {
      local_34 = *(int *)(&p_Var1->next->buffer + local_48);
    }
  }
  if (local_34 == -1) {
    lVar5._0_4_ = in_RDI->write_pending;
    lVar5._4_4_ = in_RDI->do_non_blocking_write;
    iVar3 = CMtrace_val[0xd];
    if (lVar5 == 0) {
      iVar3 = CMtrace_init(cm_00,in_stack_ffffffffffffffbc);
    }
    if (iVar3 != 0) {
      if (CMtrace_PID != 0) {
        pFVar7 = *(FILE **)&in_RDI->write_pending;
        _Var4 = getpid();
        lVar5 = (long)_Var4;
        pVar6 = pthread_self();
        fprintf(pFVar7,"P%lxT%lx - ",lVar5,pVar6);
        line = (int)((ulong)lVar5 >> 0x20);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_58);
        fprintf(*(FILE **)&in_RDI->write_pending,"%lld.%.9ld - ",local_58.tv_sec,local_58.tv_nsec);
      }
      fprintf(*(FILE **)&in_RDI->write_pending,
              "Bad mojo, failed to find global stone id after stone close of stone %d\n",
              (ulong)in_EDX);
    }
    fflush(*(FILE **)&in_RDI->write_pending);
    lVar2._0_4_ = in_RDI->write_pending;
    lVar2._4_4_ = in_RDI->do_non_blocking_write;
    iVar3 = CMtrace_val[0xd];
    if (lVar2 == 0) {
      iVar3 = CMtrace_init(cm_00,in_stack_ffffffffffffffbc);
    }
    if (iVar3 != 0) {
      if (CMtrace_PID != 0) {
        pFVar7 = *(FILE **)&in_RDI->write_pending;
        _Var4 = getpid();
        lVar5 = (long)_Var4;
        pVar6 = pthread_self();
        fprintf(pFVar7,"P%lxT%lx - ",lVar5,pVar6);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&stack0xffffffffffffff98);
        fprintf(*(FILE **)&in_RDI->write_pending,"%lld.%.9ld - ",in_stack_ffffffffffffff98,
                in_stack_ffffffffffffffa0);
      }
      fprintf(*(FILE **)&in_RDI->write_pending,
              "  If the above message occurs during shutdown, this is likely not a concern\n");
    }
    fflush(*(FILE **)&in_RDI->write_pending);
    IntCManager_unlock(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,line);
  }
  else {
    if (in_RCX[4] == 0) {
      queue_master_msg(in_stack_00000010,in_stack_00000008,unaff_retaddr,in_RDI,iVar3);
    }
    else {
      INT_CMwrite(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(void *)0x162190);
    }
    IntCManager_unlock(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,line);
  }
  return;
}

Assistant:

static void
dfg_stone_close_handler(CManager cm, CMConnection conn, int stone, 
		  void *client_data)
{
    EVclient client = (EVclient)client_data;
    event_path_data evp = cm->evp;
    int global_stone_id = -1;
    CMFormat conn_shutdown_msg = INT_CMlookup_format(client->cm, EVdfg_conn_shutdown_format_list);
    EVconn_shutdown_msg msg;
    (void)cm;
    (void)conn;
    CManager_lock(cm);
    /* first, freeze the stone so that we don't lose any more data */
    INT_EVfreeze_stone(cm, stone);

    int i;
    for (i=0; i < evp->stone_lookup_table_size; i++ ) {
	if (stone == evp->stone_lookup_table[i].local_id) {
	    global_stone_id = evp->stone_lookup_table[i].global_id;
	}
    }
    if (global_stone_id == -1) {
	CMtrace_out(cm, EVdfgVerbose, "Bad mojo, failed to find global stone id after stone close of stone %d\n", stone);
	CMtrace_out(cm, EVdfgVerbose, "  If the above message occurs during shutdown, this is likely not a concern\n");
	CManager_unlock(cm);
	return;
    }
    msg.stone = global_stone_id;
    if (client->master_connection != NULL) {
	INT_CMwrite(client->master_connection, conn_shutdown_msg, &msg);
    } else {
	queue_master_msg(client->master, (void*)&msg, DFGconn_shutdown, NULL, /*copy*/0);
    }
    CManager_unlock(client->cm);
}